

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O0

char * __thiscall
CNscContext::ReplaceToken(CNscContext *this,char *pszToken,int *nCount,string *pstrNewToken)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pvVar5;
  size_type sVar6;
  string *psVar7;
  string *in_RCX;
  int *in_RDX;
  char *in_RSI;
  long in_RDI;
  reference rVar8;
  reference rVar9;
  bool fReplacedAnyToken;
  size_t nDefineIndex;
  ReplacedDefineBitmap cReplacedDefines;
  const_iterator it;
  FastHashMapStr sLookup;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 uVar10;
  vector<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
  *in_stack_fffffffffffffee0;
  _Bit_type *in_stack_fffffffffffffee8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffef0;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  local_e0;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  local_d8;
  __node_type *local_d0;
  undefined1 in_stack_ffffffffffffff3f;
  DefineEntry *in_stack_ffffffffffffff40;
  _Bit_type *local_a8;
  _Bit_type in_stack_ffffffffffffff60;
  undefined1 __x;
  size_type in_stack_ffffffffffffff68;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  local_40;
  FastHashMapStr local_38;
  string *local_28;
  int *local_20;
  char *local_18;
  char *local_8;
  CNscContext *this_00;
  
  __x = (undefined1)(in_stack_ffffffffffffff60 >> 0x38);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar2 = std::vector<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>::
          empty(in_stack_fffffffffffffee0);
  if (bVar2) {
    local_8 = local_18;
  }
  else {
    FastHashMapStr::FastHashMapStr(&local_38,local_18,*local_20);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*,_CNscContext::FastHashMapStrHasher,_std::equal_to<CNscContext::FastHashMapStr>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>_>
         ::find(in_stack_fffffffffffffec8._M_cur,(key_type *)0x1e6033);
    std::__detail::
    _Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
    ::_Node_const_iterator
              ((_Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
                *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (_Node_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
                *)in_stack_fffffffffffffec8._M_cur);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*,_CNscContext::FastHashMapStrHasher,_std::equal_to<CNscContext::FastHashMapStr>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>_>
         ::end(in_stack_fffffffffffffec8._M_cur);
    bVar2 = std::__detail::operator==(&local_40,&local_50);
    if (bVar2) {
      local_8 = local_18;
    }
    else {
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)0x1e60ab);
      bVar2 = false;
      std::vector<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>::size
                ((vector<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_> *)
                 (in_RDI + 0x840));
      std::vector<bool,_std::allocator<bool>_>::resize
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(bool)__x);
      rVar9._M_mask = (_Bit_type)in_stack_fffffffffffffee0;
      rVar9._M_p = in_stack_fffffffffffffee8;
      do {
        pvVar5 = std::__detail::
                 _Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
                               *)0x1e60e4);
        uVar1 = pvVar5->second->nId;
        sVar6 = std::vector<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                ::size((vector<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                        *)(in_RDI + 0x840));
        if (sVar6 <= uVar1) {
          __assert_fail("nDefineIndex < m_cDefines .size ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                        ,0xa72,"char *CNscContext::ReplaceToken(char *, int *, std::string *)");
        }
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffef0,(size_type)rVar9._M_p);
        in_stack_fffffffffffffef0 = (vector<bool,_std::allocator<bool>_> *)rVar8._M_mask;
        local_a8 = rVar8._M_p;
        bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&local_a8);
        if (bVar3) break;
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffef0,(size_type)rVar9._M_p);
        this_00 = (CNscContext *)rVar9._M_p;
        uVar10 = 1;
        std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff48,true);
        bVar2 = true;
        std::__detail::
        _Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
                      *)0x1e621e);
        psVar7 = GetDefineValue_abi_cxx11_
                           (this_00,in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
        std::__cxx11::string::operator=(local_28,(string *)psVar7);
        FastHashMapStr::FastHashMapStr
                  ((FastHashMapStr *)CONCAT44(uVar10,in_stack_fffffffffffffed0),
                   (string *)in_stack_fffffffffffffec8._M_cur);
        in_stack_fffffffffffffec8._M_cur =
             (__node_type *)
             std::
             unordered_map<CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*,_CNscContext::FastHashMapStrHasher,_std::equal_to<CNscContext::FastHashMapStr>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>_>
             ::find(in_stack_fffffffffffffec8._M_cur,(key_type *)0x1e6285);
        local_d8._M_cur = in_stack_fffffffffffffec8._M_cur;
        std::__detail::
        _Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
        ::_Node_const_iterator
                  ((_Node_const_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
                    *)CONCAT44(uVar10,in_stack_fffffffffffffed0),
                   (_Node_iterator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_false,_true>
                    *)in_stack_fffffffffffffec8._M_cur);
        local_40._M_cur = local_d0;
        local_e0._M_cur =
             (__node_type *)
             std::
             unordered_map<CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*,_CNscContext::FastHashMapStrHasher,_std::equal_to<CNscContext::FastHashMapStr>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>_>
             ::end(in_stack_fffffffffffffec8._M_cur);
        bVar3 = std::__detail::operator==(&local_40,&local_e0);
      } while (!bVar3);
      if (bVar2) {
        iVar4 = std::__cxx11::string::size();
        *local_20 = iVar4;
        local_8 = (char *)std::__cxx11::string::c_str();
      }
      else {
        local_8 = local_18;
      }
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x1e634c);
    }
  }
  return local_8;
}

Assistant:

char *CNscContext::ReplaceToken (char *pszToken, int *nCount,
	std::string *pstrNewToken)
{
	typedef std::vector <bool> ReplacedDefineBitmap;

	//
	// If we have no defines then just pass through
	//

	if (m_cDefines .empty ())
		return pszToken;

	//
	// Get us out of the common path (no match) as quick as possible
	//

	FastHashMapStr sLookup (pszToken, *nCount);
	DefineLookupMap::const_iterator it = m_cDefineLookup .find (sLookup);

	if (it == m_cDefineLookup .end ())
		return pszToken;

	ReplacedDefineBitmap cReplacedDefines;
	size_t nDefineIndex;
	bool fReplacedAnyToken = false;

	cReplacedDefines .resize (m_cDefines .size ());

	//
	// Loop until we haven't replaced any defines in one iteration
	//

	for (;;)
	{
		//
		// If we have already replaced this define
		//

		nDefineIndex = it ->second ->nId;

		assert (nDefineIndex < m_cDefines .size ());

		if (cReplacedDefines [nDefineIndex])
			break;

		//
		// Mark the define as replaced in the bitmap
		//

		cReplacedDefines [nDefineIndex] = true;
		fReplacedAnyToken = true;

		//
		// Substitute it
		//

		*pstrNewToken = *GetDefineValue (it ->second);
		sLookup = *pstrNewToken;

		it = m_cDefineLookup .find (sLookup);

		if (it == m_cDefineLookup .end ())
			break;
	}

	if (!fReplacedAnyToken)
		return pszToken;

	*nCount = (int) pstrNewToken ->size ();
	return (char *) pstrNewToken ->c_str ();
}